

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Matchers::StdString::EqualsMatcher>
::MatchExpr(MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Matchers::StdString::EqualsMatcher>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
           EqualsMatcher *matcher,StringRef *matcherString)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = (*(matcher->super_StringMatcherBase).
            super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_MatcherUntypedBase._vptr_MatcherUntypedBase[3])(matcher);
  (this->super_ITransientExpression).m_isBinaryExpression = true;
  (this->super_ITransientExpression).m_result = SUB41(iVar2,0);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001b8968;
  this->m_arg = arg;
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_001b4f20;
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->m_matcher).super_StringMatcherBase.
                 super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .super_MatcherUntypedBase.m_cachedToString.field_2;
  pcVar1 = (matcher->super_StringMatcherBase).
           super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->m_matcher).super_StringMatcherBase.
              super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .super_MatcherUntypedBase.m_cachedToString,pcVar1,
             pcVar1 + (matcher->super_StringMatcherBase).
                      super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .super_MatcherUntypedBase.m_cachedToString._M_string_length);
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_001b4fd8;
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_001b5000;
  (this->m_matcher).super_StringMatcherBase.m_comparator.m_caseSensitivity =
       (matcher->super_StringMatcherBase).m_comparator.m_caseSensitivity;
  (this->m_matcher).super_StringMatcherBase.m_comparator.m_str._M_dataplus._M_p =
       (pointer)&(this->m_matcher).super_StringMatcherBase.m_comparator.m_str.field_2;
  pcVar1 = (matcher->super_StringMatcherBase).m_comparator.m_str._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_matcher).super_StringMatcherBase.m_comparator.m_str,pcVar1,
             pcVar1 + (matcher->super_StringMatcherBase).m_comparator.m_str._M_string_length);
  (this->m_matcher).super_StringMatcherBase.m_operation._M_dataplus._M_p =
       (pointer)&(this->m_matcher).super_StringMatcherBase.m_operation.field_2;
  pcVar1 = (matcher->super_StringMatcherBase).m_operation._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_matcher).super_StringMatcherBase.m_operation,pcVar1,
             pcVar1 + (matcher->super_StringMatcherBase).m_operation._M_string_length);
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_001b5018;
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_001b5048;
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = matcherString->m_size;
  (this->m_matcherString).m_data = (char *)0x0;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
                :   ITransientExpression{ true, matcher.match( arg ) },
                    m_arg( arg ),
                    m_matcher( matcher ),
                    m_matcherString( matcherString )
        {}